

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O1

bool __thiscall spvtools::opt::SSAPropagator::Simulate(SSAPropagator *this,Instruction *instr)

{
  pointer pEVar1;
  IRContext *this_00;
  pointer pOVar2;
  uint **ppuVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  PropStatus status;
  uint uVar9;
  uint32_t id;
  mapped_type *pmVar10;
  BasicBlock *b1;
  Instruction *instr_00;
  uint **ppuVar11;
  __hashtable *__h_1;
  Operand *operand;
  pointer pOVar12;
  Edge *e;
  pointer edge;
  uint32_t index;
  __node_gen_type __node_gen;
  BasicBlock *dest_bb;
  Instruction *local_68;
  undefined4 local_5c;
  Edge local_58;
  code *local_48;
  code *pcStack_40;
  BasicBlock *local_38;
  
  bVar5 = ShouldSimulateAgain(this,instr);
  if (!bVar5) {
    return false;
  }
  local_68 = (Instruction *)&stack0xffffffffffffffc8;
  local_38 = (BasicBlock *)0x0;
  local_58.source = (BasicBlock *)instr;
  if ((this->visit_fn_).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0060794b:
    std::__throw_bad_function_call();
  }
  status = (*(this->visit_fn_)._M_invoker)
                     ((_Any_data *)&this->visit_fn_,(Instruction **)&local_58,
                      (BasicBlock ***)&local_68);
  bVar5 = SetStatus(this,instr,status);
  if (status == kVarying) {
    local_58.source = (BasicBlock *)&this->do_not_simulate_;
    local_68 = instr;
    std::
    _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
              ();
    if (bVar5) {
      AddSSAEdges(this,instr);
    }
    bVar5 = spvOpcodeIsBlockTerminator(instr->opcode_);
    if (!bVar5) {
      return (bool)0;
    }
    local_58.source = IRContext::get_instr_block(this->ctx_,instr);
    pmVar10 = std::__detail::
              _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->bb_succs_,&local_58.source);
    pEVar1 = (pmVar10->super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (edge = (pmVar10->
                super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>).
                _M_impl.super__Vector_impl_data._M_start; edge != pEVar1; edge = edge + 1) {
      AddControlEdge(this,edge);
    }
    return (bool)0;
  }
  uVar4 = CONCAT31((int3)(status >> 8),status == kInteresting);
  if (status == kInteresting) {
    if (bVar5) {
      AddSSAEdges(this,instr);
    }
    if (local_38 != (BasicBlock *)0x0) {
      b1 = IRContext::get_instr_block(this->ctx_,instr);
      Edge::Edge(&local_58,b1,local_38);
      AddControlEdge(this,&local_58);
    }
  }
  if (instr->opcode_ == OpPhi) {
    uVar9 = (int)((ulong)((long)(instr->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(instr->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
    if (uVar9 < 3) goto LAB_00607929;
    index = 2;
    bVar5 = false;
    local_5c = uVar4;
    do {
      if (uVar9 - 1 <= index) {
        __assert_fail("i % 2 == 0 && i < instr->NumOperands() - 1 && \"malformed Phi arguments\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/propagator.cpp"
                      ,0x91,"bool spvtools::opt::SSAPropagator::Simulate(Instruction *)");
      }
      id = Instruction::GetSingleWordOperand(instr,index);
      this_00 = this->ctx_;
      if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(this_00);
      }
      instr_00 = analysis::DefUseManager::GetDef
                           ((this_00->def_use_mgr_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                            _M_head_impl,id);
      bVar6 = IsPhiArgExecutable(this,instr,index);
      if (bVar6) {
        bVar7 = ShouldSimulateAgain(this,instr_00);
        bVar6 = !bVar7;
        if (bVar7) {
          bVar5 = true;
        }
      }
      else {
        bVar5 = true;
        bVar6 = false;
      }
      if (!bVar6) break;
      index = index + 2;
      uVar9 = (int)((ulong)((long)(instr->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(instr->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
    } while (index < uVar9);
  }
  else {
    local_58.dest = (BasicBlock *)0x0;
    pcStack_40 = std::
                 _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/propagator.cpp:159:31)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/propagator.cpp:159:31)>
               ::_M_manager;
    pOVar12 = (instr->operands_).
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pOVar2 = (instr->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar5 = pOVar12 == pOVar2;
    local_5c = uVar4;
    local_58.source = (BasicBlock *)this;
    if (!bVar5) {
      bVar5 = false;
      do {
        bVar6 = spvIsInIdType(pOVar12->type);
        if (bVar6) {
          ppuVar3 = (uint **)(pOVar12->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar11 = &(pOVar12->words).small_data_;
          if (ppuVar3 != (uint **)0x0) {
            ppuVar11 = ppuVar3;
          }
          local_68 = (Instruction *)*ppuVar11;
          if (local_48 == (code *)0x0) goto LAB_0060794b;
          cVar8 = (*pcStack_40)(&local_58,&local_68);
          if (cVar8 == '\0') break;
        }
        pOVar12 = pOVar12 + 1;
        bVar5 = pOVar12 == pOVar2;
      } while (!bVar5);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    bVar5 = (bool)(bVar5 ^ 1);
  }
  uVar4 = local_5c;
  if (bVar5) {
    return (bool)(char)local_5c;
  }
LAB_00607929:
  local_58.source = (BasicBlock *)&this->do_not_simulate_;
  local_68 = instr;
  std::
  _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
            ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_58.source);
  return (bool)(char)uVar4;
}

Assistant:

bool SSAPropagator::Simulate(Instruction* instr) {
  bool changed = false;

  // Don't bother visiting instructions that should not be simulated again.
  if (!ShouldSimulateAgain(instr)) {
    return changed;
  }

  BasicBlock* dest_bb = nullptr;
  PropStatus status = visit_fn_(instr, &dest_bb);
  bool status_changed = SetStatus(instr, status);

  if (status == kVarying) {
    // The statement produces a varying result, add it to the list of statements
    // not to simulate anymore and add its SSA def-use edges for simulation.
    DontSimulateAgain(instr);
    if (status_changed) {
      AddSSAEdges(instr);
    }

    // If |instr| is a block terminator, add all the control edges out of its
    // block.
    if (instr->IsBlockTerminator()) {
      BasicBlock* block = ctx_->get_instr_block(instr);
      for (const auto& e : bb_succs_.at(block)) {
        AddControlEdge(e);
      }
    }
    return false;
  } else if (status == kInteresting) {
    // Add the SSA edges coming out of this instruction if the propagation
    // status has changed.
    if (status_changed) {
      AddSSAEdges(instr);
    }

    // If there are multiple outgoing control flow edges and we know which one
    // will be taken, add the destination block to the CFG work list.
    if (dest_bb) {
      AddControlEdge(Edge(ctx_->get_instr_block(instr), dest_bb));
    }
    changed = true;
  }

  // At this point, we are dealing with instructions that are in status
  // kInteresting or kNotInteresting.  To decide whether this instruction should
  // be simulated again, we examine its operands.  If at least one operand O is
  // defined at an instruction D that should be simulated again, then the output
  // of D might affect |instr|, so we should simulate |instr| again.
  bool has_operands_to_simulate = false;
  if (instr->opcode() == spv::Op::OpPhi) {
    // For Phi instructions, an operand causes the Phi to be simulated again if
    // the operand comes from an edge that has not yet been traversed or if its
    // definition should be simulated again.
    for (uint32_t i = 2; i < instr->NumOperands(); i += 2) {
      // Phi arguments come in pairs. Index 'i' contains the
      // variable id, index 'i + 1' is the originating block id.
      assert(i % 2 == 0 && i < instr->NumOperands() - 1 &&
             "malformed Phi arguments");

      uint32_t arg_id = instr->GetSingleWordOperand(i);
      Instruction* arg_def_instr = get_def_use_mgr()->GetDef(arg_id);
      if (!IsPhiArgExecutable(instr, i) || ShouldSimulateAgain(arg_def_instr)) {
        has_operands_to_simulate = true;
        break;
      }
    }
  } else {
    // For regular instructions, check if the defining instruction of each
    // operand needs to be simulated again.  If so, then this instruction should
    // also be simulated again.
    has_operands_to_simulate =
        !instr->WhileEachInId([this](const uint32_t* use) {
          Instruction* def_instr = get_def_use_mgr()->GetDef(*use);
          if (ShouldSimulateAgain(def_instr)) {
            return false;
          }
          return true;
        });
  }

  if (!has_operands_to_simulate) {
    DontSimulateAgain(instr);
  }

  return changed;
}